

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
pstore::json::details::string_matcher<pstore::json::null_output>::appender::append32
          (appender *this,char32_t code_point)

{
  char16_t cVar1;
  
  cVar1 = this->high_surrogate_;
  if (cVar1 == L'\0') {
    utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>
              (code_point,(this->result_).ptr_);
  }
  return cVar1 == L'\0';
}

Assistant:

bool has_high_surrogate () const noexcept { return high_surrogate_ != 0; }